

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

Binasc * __thiscall smf::Binasc::keyToPitchName_abi_cxx11_(Binasc *this,int key)

{
  char *pcVar1;
  allocator local_1d9;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream output;
  ostream local_198 [380];
  int local_1c;
  int local_18;
  int octave;
  int pc;
  int key_local;
  
  local_18 = key + (((uint)(key / 6 + (key >> 0x1f)) >> 1) - (key >> 0x1f)) * -0xc;
  local_1c = key / 0xc + -1;
  octave = key;
  _pc = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  switch(local_18) {
  case 0:
    std::operator<<(local_198,"C");
    break;
  case 1:
    std::operator<<(local_198,"C#");
    break;
  case 2:
    std::operator<<(local_198,"D");
    break;
  case 3:
    std::operator<<(local_198,"D#");
    break;
  case 4:
    std::operator<<(local_198,"E");
    break;
  case 5:
    std::operator<<(local_198,"F");
    break;
  case 6:
    std::operator<<(local_198,"F#");
    break;
  case 7:
    std::operator<<(local_198,"G");
    break;
  case 8:
    std::operator<<(local_198,"G#");
    break;
  case 9:
    std::operator<<(local_198,"A");
    break;
  case 10:
    std::operator<<(local_198,"A#");
    break;
  case 0xb:
    std::operator<<(local_198,"B");
  }
  std::ostream::operator<<(local_198,local_1c);
  std::__cxx11::stringstream::str();
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar1,&local_1d9);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string Binasc::keyToPitchName(int key) {
	int pc = key % 12;
	int octave = key / 12 - 1;
	std::stringstream output;
	switch (pc) {
		case  0: output << "C";  break;
		case  1: output << "C#"; break;
		case  2: output << "D";  break;
		case  3: output << "D#"; break;
		case  4: output << "E";  break;
		case  5: output << "F";  break;
		case  6: output << "F#"; break;
		case  7: output << "G";  break;
		case  8: output << "G#"; break;
		case  9: output << "A";  break;
		case 10: output << "A#"; break;
		case 11: output << "B";  break;
	}
	output << octave;
	return output.str().c_str();
}